

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClrDirWrapper.cpp
# Opt level: O1

QString * ClrDirWrapper::translateFlag(QString *__return_storage_ptr__,DWORD flags)

{
  char *ch;
  storage_type *psVar1;
  QByteArrayView QVar2;
  Data *local_28;
  char16_t *local_20;
  qsizetype local_18;
  
  if ((flags & 1) == 0) {
    if ((flags & 2) == 0) {
      if ((flags & 4) == 0) {
        if ((flags & 8) == 0) {
          if ((flags & 0x10) == 0) {
            if ((flags >> 0x10 & 1) == 0) {
              ch = "";
            }
            else {
              ch = "Track Debug Data";
            }
            QString::QString(__return_storage_ptr__,ch);
            return __return_storage_ptr__;
          }
          psVar1 = (storage_type *)0x11;
        }
        else {
          psVar1 = (storage_type *)0x12;
        }
      }
      else {
        psVar1 = (storage_type *)0xa;
      }
    }
    else {
      psVar1 = (storage_type *)0xf;
    }
  }
  else {
    psVar1 = (storage_type *)0x7;
  }
  QVar2.m_data = psVar1;
  QVar2.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar2);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = local_28;
  (__return_storage_ptr__->d).ptr = local_20;
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

QString ClrDirWrapper::translateFlag(DWORD flags)
{
    if (flags & pe::COMIMAGE_FLAGS_ILONLY) {
        return ("IL Only");
    }
    if (flags & pe::COMIMAGE_FLAGS_32BITREQUIRED) {
        return("32-bit required");
    }
    if (flags & pe::COMIMAGE_FLAGS_IL_LIBRARY) {
        return ("IL Library");
    }
    if (flags & pe::COMIMAGE_FLAGS_STRONGNAMESIGNED) {
        return("Strong Name Signed");
    }
    if (flags & pe::COMIMAGE_FLAGS_NATIVE_ENTRYPOINT) {
        return("Native EntryPoint");
    }
    if (flags & pe::COMIMAGE_FLAGS_TRACKDEBUGDATA) {
        return("Track Debug Data");
    }
    return "";
}